

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

QExpression * __thiscall
Qentem::Array<Qentem::QExpression>::allocate(Array<Qentem::QExpression> *this)

{
  SizeT size;
  QExpression *ptr;
  QExpression *new_storage;
  Array<Qentem::QExpression> *this_local;
  
  size = Capacity(this);
  ptr = Memory::Allocate<Qentem::QExpression>(size);
  setStorage(this,ptr);
  return ptr;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }